

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

bool __thiscall
iutest::detail::PairMatcher<iutest::detail::GtMatcher<int>,int>::CheckElem<int,int>
          (PairMatcher<iutest::detail::GtMatcher<int>,int> *this,int *actual,int *matcher)

{
  bool bVar1;
  EqMatcher<int> local_58;
  AssertionResult local_48;
  int *local_20;
  int *matcher_local;
  int *actual_local;
  PairMatcher<iutest::detail::GtMatcher<int>,_int> *this_local;
  
  local_20 = matcher;
  matcher_local = actual;
  actual_local = (int *)this;
  CastToMatcher<int>((int *)&local_58,(type **)matcher);
  EqMatcher<int>::operator()(&local_48,&local_58,matcher_local);
  bVar1 = AssertionResult::operator_cast_to_bool(&local_48);
  AssertionResult::~AssertionResult(&local_48);
  EqMatcher<int>::~EqMatcher(&local_58);
  return bVar1;
}

Assistant:

bool CheckElem(const T& actual, U& matcher)
    {
        return static_cast<bool>(CastToMatcher(matcher)(actual));
    }